

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O2

void __thiscall DependanceEstimator::~DependanceEstimator(DependanceEstimator *this)

{
  double **ppdVar1;
  int i;
  long lVar2;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DependanceEstimator_001548c8;
  if (this->aSamples != (double *)0x0) {
    operator_delete__(this->aSamples);
  }
  if (this->aOne != (double *)0x0) {
    operator_delete__(this->aOne);
  }
  if (this->aTwo != (double *)0x0) {
    operator_delete__(this->aTwo);
  }
  if (this->aThree != (double *)0x0) {
    operator_delete__(this->aThree);
  }
  if (this->aDist != (double **)0x0) {
    for (lVar2 = 0; ppdVar1 = this->aDist, lVar2 < this->dependanceBins; lVar2 = lVar2 + 1) {
      if (ppdVar1[lVar2] != (double *)0x0) {
        operator_delete__(ppdVar1[lVar2]);
      }
    }
    if (ppdVar1 != (double **)0x0) {
      operator_delete__(ppdVar1);
    }
  }
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

DependanceEstimator::~DependanceEstimator()
{
	if (aSamples)
		delete[] aSamples;
	if (aOne)
		delete[] aOne;
	if (aTwo)
		delete[] aTwo;
	if (aThree)
		delete[] aThree;
	if (aDist) {
		for (int i=0; i<dependanceBins; ++i)
			delete[] aDist[i];
		delete[] aDist;
	}
}